

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_read_legacy_regex(void)

{
  int iVar1;
  undefined8 uVar2;
  char **ppcVar3;
  char **ppcVar4;
  char *pcVar5;
  char *flags;
  char *pattern;
  _Bool r;
  bson_error_t error;
  bson_t b;
  undefined4 uVar6;
  char *local_398;
  char *local_390;
  byte local_381;
  uint local_380;
  uint local_37c;
  char acStack_378 [504];
  undefined1 local_180 [376];
  
  local_381 = bson_init_from_json(local_180,"{\"a\": {\"$regex\": \"abc\", \"$options\": \"ix\"}}",
                                  0xffffffffffffffff,&local_380);
  local_381 = local_381 & 1;
  if (local_381 == 0) {
    fprintf(_stderr,"FAIL:%s:%d  %s()\n  %s\n  %s\n\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x469,"test_bson_json_read_legacy_regex","r",acStack_378);
    fflush(_stderr);
    abort();
  }
  uVar2 = bson_bcone_magic();
  ppcVar3 = bcon_ensure_const_char_ptr_ptr(&local_390);
  ppcVar4 = bcon_ensure_const_char_ptr_ptr(&local_398);
  uVar6 = 0;
  bcon_extract(local_180,"a",uVar2,10,ppcVar3,ppcVar4,0);
  if (local_390 != "abc") {
    iVar1 = strcmp(local_390,"abc");
    if (iVar1 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",local_390,"abc");
      abort();
    }
  }
  if (local_398 != "ix") {
    iVar1 = strcmp(local_398,"ix");
    if (iVar1 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",local_398,"ix");
      abort();
    }
  }
  bson_destroy(local_180);
  local_381 = bson_init_from_json(local_180,"{\"a\": {\"$regex\": \"abc\"}}",0xffffffffffffffff,
                                  &local_380);
  local_381 = local_381 & 1;
  if (((local_381 ^ 0xff) & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x471,"test_bson_json_read_legacy_regex","!r");
    abort();
  }
  if (local_380 != 1) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_380,"==",1,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            CONCAT44(uVar6,0x475),"test_bson_json_read_legacy_regex");
    abort();
  }
  if (local_37c != 2) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_37c,"==",2,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            CONCAT44(uVar6,0x475),"test_bson_json_read_legacy_regex");
    abort();
  }
  pcVar5 = strstr(acStack_378,"Missing \"$options\" after \"$regex\"");
  if (pcVar5 == (char *)0x0) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_378,
            "Missing \"$options\" after \"$regex\"");
    abort();
  }
  local_381 = bson_init_from_json(local_180,"{\"a\": {\"$options\": \"ix\"}}",0xffffffffffffffff,
                                  &local_380);
  local_381 = local_381 & 1;
  if (((local_381 ^ 0xff) & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x478,"test_bson_json_read_legacy_regex","!r");
    abort();
  }
  if (local_380 != 1) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_380,"==",1,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            CONCAT44(uVar6,0x47c),"test_bson_json_read_legacy_regex");
    abort();
  }
  if (local_37c != 2) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_37c,"==",2,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            CONCAT44(uVar6,0x47c),"test_bson_json_read_legacy_regex");
    abort();
  }
  pcVar5 = strstr(acStack_378,"Missing \"$regex\" after \"$options\"");
  if (pcVar5 == (char *)0x0) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_378,
            "Missing \"$regex\" after \"$options\"");
    abort();
  }
  return;
}

Assistant:

static void
test_bson_json_read_legacy_regex (void)
{
   bson_t b;
   bson_error_t error;
   bool r;
   const char *pattern;
   const char *flags;

   r = bson_init_from_json (
      &b, "{\"a\": {\"$regex\": \"abc\", \"$options\": \"ix\"}}", -1, &error);
   ASSERT_OR_PRINT (r, error);
   BCON_EXTRACT (&b, "a", BCONE_REGEX (pattern, flags));
   ASSERT_CMPSTR (pattern, "abc");
   ASSERT_CMPSTR (flags, "ix");

   bson_destroy (&b);

   r = bson_init_from_json (&b, "{\"a\": {\"$regex\": \"abc\"}}", -1, &error);
   BSON_ASSERT (!r);
   ASSERT_ERROR_CONTAINS (error,
                          BSON_ERROR_JSON,
                          BSON_JSON_ERROR_READ_INVALID_PARAM,
                          "Missing \"$options\" after \"$regex\"");

   r = bson_init_from_json (&b, "{\"a\": {\"$options\": \"ix\"}}", -1, &error);
   BSON_ASSERT (!r);
   ASSERT_ERROR_CONTAINS (error,
                          BSON_ERROR_JSON,
                          BSON_JSON_ERROR_READ_INVALID_PARAM,
                          "Missing \"$regex\" after \"$options\"");
}